

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connect-unspecified.c
# Opt level: O0

int run_test_connect_unspecified(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_connect_t connect6;
  sockaddr_in6 addr6;
  uv_tcp_t socket6;
  uv_connect_t connect4;
  sockaddr_in addr4;
  uv_tcp_t socket4;
  uv_loop_t *loop;
  
  loop_00 = uv_default_loop();
  iVar1 = uv_tcp_init(loop_00,(uv_tcp_t *)addr4.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
            ,0x2c,"uv_tcp_init(loop, &socket4)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&connect4.queue.prev);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
            ,0x2d,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr4)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_connect((uv_connect_t *)&socket6.queued_fds,(uv_tcp_t *)addr4.sin_zero,
                         (sockaddr *)&connect4.queue.prev,connect_4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
            ,0x31,"uv_tcp_connect(&connect4, &socket4, (const struct sockaddr*) &addr4, connect_4)",
            "==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = can_ipv6();
  if (iVar1 != 0) {
    iVar1 = uv_tcp_init(loop_00,(uv_tcp_t *)((long)&addr6.sin6_addr.__in6_u + 0xc));
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
              ,0x34,"uv_tcp_init(loop, &socket6)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_ip6_addr("::",0x23a3,(sockaddr_in6 *)((long)&connect6.queue.prev + 4));
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
              ,0x35,"uv_ip6_addr(\"::\", 9123, &addr6)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_tcp_connect((uv_connect_t *)&eval_a,
                           (uv_tcp_t *)((long)&addr6.sin6_addr.__in6_u + 0xc),
                           (sockaddr *)((long)&connect6.queue.prev + 4),connect_6);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
              ,0x39,
              "uv_tcp_connect(&connect6, &socket6, (const struct sockaddr*) &addr6, connect_6)","=="
              ,"0",(long)iVar1,"==",0);
      abort();
    }
  }
  iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
            ,0x3c,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
          ,0x3e,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(connect_unspecified) {
  uv_loop_t* loop;
  uv_tcp_t socket4;
  struct sockaddr_in addr4;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  struct sockaddr_in6 addr6;
  uv_connect_t connect6;

  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &socket4));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr4));
  ASSERT_OK(uv_tcp_connect(&connect4,
                           &socket4,
                           (const struct sockaddr*) &addr4,
                           connect_4));

  if (can_ipv6()) {
    ASSERT_OK(uv_tcp_init(loop, &socket6));
    ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr6));
    ASSERT_OK(uv_tcp_connect(&connect6,
                             &socket6,
                             (const struct sockaddr*) &addr6,
                             connect_6));
  }

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}